

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Unpack(int g_src,int g_dest,int g_mask,int lo,int hi,int *icount)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  undefined4 *in_R9;
  Integer ahi;
  Integer alo;
  Integer icnt;
  Integer s;
  Integer b;
  Integer a;
  Integer *in_stack_ffffffffffffffa8;
  Integer in_stack_ffffffffffffffc0;
  
  pnga_unpack((long)in_ESI,(long)in_EDX,in_stack_ffffffffffffffc0,(long)(in_ECX + 1),
              (long)(in_R8D + 1),in_stack_ffffffffffffffa8);
  *in_R9 = (int)in_stack_ffffffffffffffc0;
  return;
}

Assistant:

void GA_Unpack(int g_src, int g_dest, int g_mask, int lo, int hi, int *icount)
{
     Integer a = (Integer)g_src;
     Integer b = (Integer)g_dest;
     Integer s = (Integer)g_mask;
     Integer icnt;
     Integer alo = lo+1;
     Integer ahi = hi+1;
     wnga_unpack(a, b, s, alo, ahi, &icnt); 
     *icount = icnt;
}